

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall tcu::ThreadUtil::Thread::~Thread(Thread *this)

{
  pointer ppOVar1;
  pointer ppOVar2;
  int operationNdx;
  long lVar3;
  
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_003e1d70;
  lVar3 = 0;
  while( true ) {
    ppOVar1 = (this->m_operations).
              super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppOVar2 = (this->m_operations).
              super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppOVar2 - (long)ppOVar1) >> 3) <= lVar3) break;
    if (ppOVar1[lVar3] != (Operation *)0x0) {
      (*ppOVar1[lVar3]->_vptr_Operation[1])();
    }
    lVar3 = lVar3 + 1;
  }
  if (ppOVar2 != ppOVar1) {
    (this->m_operations).
    super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppOVar1;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  std::vector<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>::~vector
            (&this->m_messages);
  de::Mutex::~Mutex(&this->m_messageLock);
  std::_Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>::
  ~_Vector_base(&(this->m_operations).
                 super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
               );
  de::Thread::~Thread(&this->super_Thread);
  return;
}

Assistant:

Thread::~Thread (void)
{
	for (int operationNdx = 0; operationNdx < (int)m_operations.size(); operationNdx++)
		delete m_operations[operationNdx];

	m_operations.clear();
}